

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int minTemp2_fast_moreThen5(word *pInOut,int iVar,int iQ,int jQ,int nWords,int *pDifStart)

{
  int iVar1;
  int iVar2;
  int shiftBlock;
  int wordBlock;
  int temp;
  int j;
  int i;
  int *pDifStart_local;
  int nWords_local;
  int jQ_local;
  int iQ_local;
  int iVar_local;
  word *pInOut_local;
  
  iVar1 = 1 << ((char)iVar - 6U & 0x1f);
  temp = nWords + -1;
  do {
    if (temp < 0) {
      *pDifStart = 0;
      return 0;
    }
    for (wordBlock = 0; wordBlock < iVar1; wordBlock = wordBlock + 1) {
      iVar2 = CompareWords(pInOut[(temp - wordBlock) - iQ * iVar1],
                           pInOut[(temp - wordBlock) - jQ * iVar1]);
      if (iVar2 != 0) {
        if (iVar2 == -1) {
          *pDifStart = temp + 1;
          return 0;
        }
        *pDifStart = temp + 1;
        return 1;
      }
    }
    temp = temp + iVar1 * -4;
  } while( true );
}

Assistant:

int minTemp2_fast_moreThen5(word* pInOut, int iVar, int iQ, int jQ, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp2_fast_moreThen5\n");

    for(i=nWords - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j-iQ*wordBlock],pInOut[i-j-jQ*wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+1;
                return 0;
            }
            else
            {
                *pDifStart = i+1;
                return 1;
            }
        }
    *pDifStart=0;
//    printf("out minTemp2_fast_moreThen5\n");
    
    return 0;
}